

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::PrepareBackgroundFindRoots(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  void **ppvVar3;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *node;
  GuestArenaAllocator *pGVar4;
  undefined8 *in_FS_OFFSET;
  GuestArenaAllocator *allocator;
  EditingIterator guestArenaIter;
  Recycler *this_local;
  
  guestArenaIter.super_Iterator.current = (NodeBase *)this;
  if ((this->hasPendingConcurrentFindRoot & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15c3,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->hasPendingConcurrentFindRoot = true;
  ppvVar3 = SavedRegisterState::GetRegisters(&this->savedThreadContext);
  amd64_SAVE_REGISTERS(ppvVar3);
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  ::DisableResize(&this->pinnedObjectMap);
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::EditingIterator
            ((EditingIterator *)&allocator,&this->guestArenaList);
  while( true ) {
    if (guestArenaIter.super_Iterator.list ==
        (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pGVar4 = allocator;
    node = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                     (&(guestArenaIter.super_Iterator.list)->
                       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    bVar2 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::IsHead
                      ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)pGVar4,node);
    if (bVar2) break;
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
         DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                   (&(guestArenaIter.super_Iterator.list)->
                     super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)&allocator);
    ArenaData::SetLockBlockList
              (&(pGVar4->super_ArenaAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_ArenaData,true);
    if ((pGVar4->pendingDelete & 1U) == 0) {
      if (this->backgroundFinishMarkCount == '\0') {
        ArenaData::GetBigBlocks
                  (&(pGVar4->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData,false);
      }
    }
    else {
      if ((this->hasPendingDeleteGuestArena & 1U) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x15d9,"(this->hasPendingDeleteGuestArena)",
                           "this->hasPendingDeleteGuestArena");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      ArenaData::SetLockBlockList
                (&(pGVar4->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_ArenaData,false);
      DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)&allocator,&HeapAllocator::Instance);
    }
  }
  this->hasPendingDeleteGuestArena = false;
  return;
}

Assistant:

void
Recycler::PrepareBackgroundFindRoots()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    this->hasPendingConcurrentFindRoot = true;

    // Save the thread context here. The background thread
    // will use this saved context for the marking instead of
    // trying to get the live thread context of the thread
    SAVE_THREAD_CONTEXT();

    // Temporarily disable resize so the background can scan without
    // the memory being freed from under it
    pinnedObjectMap.DisableResize();

    // Update the cached info for big blocks in the guest arena

    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        allocator.SetLockBlockList(true);

        if (allocator.pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
            allocator.SetLockBlockList(false);
            guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
        }
        else if (this->backgroundFinishMarkCount == 0)
        {
            // Update the cached info for big block
            allocator.GetBigBlocks(false);
        }
    }
    this->hasPendingDeleteGuestArena = false;
}